

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::CheckGetXFBVarying::check
          (CheckGetXFBVarying *this,GLuint program,GLuint capture_way,GLuint shader_case,
          GLuint varying_type,GLuint number_of_attributes)

{
  long lVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLint i;
  uint uVar4;
  uint local_d4;
  GLenum type;
  GLsizei size;
  GLsizei length;
  GLuint local_bc;
  long local_b8;
  VaryingType *local_b0;
  GLchar name [18];
  GLint xfb_varying_max_length;
  GLint xfb_mode;
  GLint xfb_varyings;
  
  local_bc = capture_way;
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  local_b8 = CONCAT44(extraout_var,iVar2);
  local_b0 = s_varying_types + varying_type;
  uVar4 = 0;
  local_d4 = 0;
  while( true ) {
    lVar1 = local_b8;
    if (number_of_attributes == uVar4) {
      xfb_varyings = 0;
      xfb_mode = 0;
      xfb_varying_max_length = 0;
      (**(code **)(local_b8 + 0x9d8))(program,0x8c83,&xfb_varyings);
      (**(code **)(lVar1 + 0x9d8))(program,0x8c7f,&xfb_mode);
      (**(code **)(lVar1 + 0x9d8))(program,0x8c76,&xfb_varying_max_length);
      dVar3 = (**(code **)(lVar1 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xea1);
      if ((xfb_varyings == number_of_attributes) && (xfb_mode == s_capture_ways[local_bc])) {
        return local_d4 <= (uint)xfb_varying_max_length;
      }
      return false;
    }
    length = 0;
    size = 0;
    type = 0;
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    name[0x10] = '\0';
    name[0x11] = '\0';
    (**(code **)(local_b8 + 0xb18))(program,uVar4,0x12,&length,&size,&type,name);
    dVar3 = (**(code **)(lVar1 + 0x800))();
    glu::checkError(dVar3,"glGetTransformFeedbackVarying call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xe74);
    if (local_d4 <= (uint)length) {
      local_d4 = length;
    }
    if (length == 0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xfb_varyings,name,(allocator<char> *)&xfb_mode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xfb_mode,"result_",(allocator<char> *)&xfb_varying_max_length);
    Utilities::itoa_abi_cxx11_((string *)&xfb_varying_max_length,(Utilities *)(ulong)uVar4,i);
    std::__cxx11::string::append((string *)&xfb_mode);
    std::__cxx11::string::~string((string *)&xfb_varying_max_length);
    iVar2 = std::__cxx11::string::compare((string *)&xfb_varyings);
    std::__cxx11::string::~string((string *)&xfb_mode);
    std::__cxx11::string::~string((string *)&xfb_varyings);
    if (iVar2 != 0) {
      return false;
    }
    if (size != 1) {
      return false;
    }
    uVar4 = uVar4 + 1;
    if (type != local_b0->type) {
      return false;
    }
  }
  return false;
}

Assistant:

bool gl3cts::TransformFeedback::CheckGetXFBVarying::check(glw::GLuint program, glw::GLuint capture_way,
														  glw::GLuint shader_case UNUSED, glw::GLuint varying_type,
														  glw::GLuint number_of_attributes)
{
	/* Functions handler */
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	glw::GLuint			  max_length = 0;

	/* Inspect glGetTransformFeedbackVarying. */
	for (glw::GLuint i = 0; i < number_of_attributes; ++i)
	{
		const glw::GLsizei bufSize  = 18;
		glw::GLsizei	   length   = 0;
		glw::GLsizei	   size		= 0;
		glw::GLenum		   type		= GL_NONE;
		glw::GLchar		   name[18] = { 0 }; /* Size of bufSize. */

		gl.getTransformFeedbackVarying(program, i, bufSize, &length, &size, &type, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbackVarying call failed.");

		max_length = deMaxu32(max_length, glw::GLuint(length));

		/* Check name. */
		if (length)
		{
			std::string varying		= name;
			std::string varying_ref = "result_";
			varying_ref.append(gl3cts::TransformFeedback::Utilities::itoa(i));

			if (0 != varying.compare(varying_ref))
			{
				return false;
			}
		}
		else
		{
			return false;
		}

		/* Check size. */
		const glw::GLuint size_ref = 1;

		if (size != size_ref)
		{
			return false;
		}

		/* Check type. */
		if (type != s_varying_types[varying_type].type)
		{
			return false;
		}
	}

	/* Inspect glGetProgramiv. */
	glw::GLint xfb_varyings			  = 0;
	glw::GLint xfb_mode				  = 0;
	glw::GLint xfb_varying_max_length = 0;

	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYINGS, &xfb_varyings);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_BUFFER_MODE, &xfb_mode);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYING_MAX_LENGTH, &xfb_varying_max_length);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (glw::GLuint(xfb_varyings) != number_of_attributes)
	{
		return false;
	}

	if (glw::GLenum(xfb_mode) != s_capture_ways[capture_way])
	{
		return false;
	}

	if (glw::GLuint(xfb_varying_max_length) < max_length)
	{
		return false;
	}

	return true;
}